

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

bool __thiscall csv::CSVReader::read_row(CSVReader *this,CSVRow *row)

{
  bool bVar1;
  pointer pTVar2;
  pointer this_00;
  CSVRow *this_01;
  size_t sVar3;
  runtime_error *prVar4;
  char *in_R8;
  string_view delim;
  string_view delim_00;
  CSVRow local_180;
  undefined1 local_151;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e1;
  basic_string_view<char,_std::char_traits<char>_> local_e0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  CSVRow errored_row;
  code *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  CSVRow *row_local;
  CSVReader *this_local;
  
  local_28._8_8_ = row;
  row_local = (CSVRow *)this;
  while( true ) {
    while( true ) {
      pTVar2 = std::
               unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
               ::operator->(&this->records);
      bVar1 = internals::ThreadSafeDeque<csv::CSVRow>::empty(pTVar2);
      if (!bVar1) break;
      pTVar2 = std::
               unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
               ::operator->(&this->records);
      bVar1 = internals::ThreadSafeDeque<csv::CSVRow>::is_waitable(pTVar2);
      if (bVar1) {
        pTVar2 = std::
                 unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                 ::operator->(&this->records);
        internals::ThreadSafeDeque<csv::CSVRow>::wait(pTVar2,row);
      }
      else {
        this_00 = std::
                  unique_ptr<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
                  ::operator->(&this->parser);
        bVar1 = internals::IBasicCSVParser::eof(this_00);
        if (bVar1) {
          return false;
        }
        bVar1 = std::thread::joinable(&this->read_csv_worker);
        if (bVar1) {
          std::thread::join();
        }
        local_38 = read_csv;
        local_30 = 0;
        errored_row.row_length = (size_t)this;
        std::thread::
        thread<bool(csv::CSVReader::*)(unsigned_long),csv::CSVReader*,unsigned_long_const&,void>
                  ((thread *)local_28,(type *)&local_38,(CSVReader **)&errored_row.row_length,
                   &internals::ITERATION_CHUNK_SIZE);
        row = (CSVRow *)local_28;
        std::thread::operator=(&this->read_csv_worker,(thread *)row);
        std::thread::~thread((thread *)local_28);
      }
    }
    pTVar2 = std::
             unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
             ::operator->(&this->records);
    this_01 = internals::ThreadSafeDeque<csv::CSVRow>::front(pTVar2);
    sVar3 = CSVRow::size(this_01);
    if ((sVar3 == this->n_cols) || ((this->_format).variable_column_policy == KEEP)) break;
    row = (CSVRow *)
          std::
          unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
          ::operator->(&this->records);
    internals::ThreadSafeDeque<csv::CSVRow>::pop_front
              ((CSVRow *)local_68,(ThreadSafeDeque<csv::CSVRow> *)row);
    if ((this->_format).variable_column_policy == THROW) {
      sVar3 = CSVRow::size((CSVRow *)local_68);
      if (sVar3 < this->n_cols) {
        local_e1 = 1;
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        CSVRow::operator_cast_to_vector(&local_c0,(CSVRow *)local_68);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_e0,", ");
        delim._M_str = in_R8;
        delim._M_len = (size_t)local_e0[0]._M_str;
        internals::format_row
                  (&local_a8,(internals *)&local_c0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e0[0]._M_len,delim);
        std::operator+(&local_88,"Line too short ",&local_a8);
        std::runtime_error::runtime_error(prVar4,(string *)&local_88);
        local_e1 = 0;
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_151 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      CSVRow::operator_cast_to_vector(&local_140,(CSVRow *)local_68);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,", ");
      delim_00._M_str = in_R8;
      delim_00._M_len = (size_t)local_150._M_str;
      internals::format_row
                (&local_128,(internals *)&local_140,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_150._M_len,delim_00);
      std::operator+(&local_108,"Line too long ",&local_128);
      std::runtime_error::runtime_error(prVar4,(string *)&local_108);
      local_151 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    CSVRow::~CSVRow((CSVRow *)local_68);
  }
  pTVar2 = std::
           unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
           ::operator->(&this->records);
  internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_180,pTVar2);
  CSVRow::operator=((CSVRow *)local_28._8_8_,&local_180);
  CSVRow::~CSVRow(&local_180);
  this->_n_rows = this->_n_rows + 1;
  return true;
}

Assistant:

CSV_INLINE bool CSVReader::read_row(CSVRow &row) {
        while (true) {
            if (this->records->empty()) {
                if (this->records->is_waitable())
                    // Reading thread is currently active => wait for it to populate records
                    this->records->wait();
                else if (this->parser->eof())
                    // End of file and no more records
                    return false;
                else {
                    // Reading thread is not active => start another one
                    if (this->read_csv_worker.joinable())
                        this->read_csv_worker.join();

                    this->read_csv_worker = std::thread(&CSVReader::read_csv, this, internals::ITERATION_CHUNK_SIZE);
                }
            }
            else if (this->records->front().size() != this->n_cols &&
                this->_format.variable_column_policy != VariableColumnPolicy::KEEP) {
                auto errored_row = this->records->pop_front();

                if (this->_format.variable_column_policy == VariableColumnPolicy::THROW) {
                    if (errored_row.size() < this->n_cols)
                        throw std::runtime_error("Line too short " + internals::format_row(errored_row));

                    throw std::runtime_error("Line too long " + internals::format_row(errored_row));
                }
            }
            else {
                row = this->records->pop_front();
                this->_n_rows++;
                return true;
            }
        }

        return false;
    }